

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  ushort uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  parasail_result_t *result;
  __m128i *palVar9;
  __m128i *palVar10;
  __m128i *b;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  size_t len;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  char *__format;
  uint uVar22;
  __m128i *palVar23;
  ulong uVar24;
  uint uVar25;
  ulong size;
  __m128i *palVar26;
  ulong uVar27;
  long lVar28;
  __m128i_64_t B;
  undefined1 auVar29 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  __m128i_64_t B_3;
  longlong lVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i_64_t B_2;
  __m128i_64_t B_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i c;
  __m128i c_00;
  __m128i a;
  __m128i a_00;
  __m128i b_00;
  __m128i b_01;
  __m128i *local_118;
  ulong local_110;
  ulong local_f8;
  long lStack_d0;
  ulong uStack_50;
  ulong uStack_40;
  longlong extraout_RDX;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar17 = "profile->matrix";
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar17 = "s2";
        }
        else {
          uVar24 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar17 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar17 = "open";
          }
          else {
            if (-1 < gap) {
              iVar8 = ppVar3->max;
              iVar12 = open;
              result = parasail_result_new_table1((uint)((ulong)uVar25 + 1) & 0x7ffffffe,s2Len);
              if (result != (parasail_result_t *)0x0) {
                size = (ulong)uVar25 + 1 >> 1;
                result->flag = result->flag | 0x2820804;
                palVar9 = parasail_memalign___m128i(0x10,size);
                palVar10 = parasail_memalign___m128i(0x10,size);
                local_118 = parasail_memalign___m128i(0x10,size);
                b = parasail_memalign___m128i(0x10,size);
                auVar38._0_4_ = -(uint)((int)((ulong)palVar9 >> 0x20) == 0 && (int)palVar9 == 0);
                auVar38._4_4_ = -(uint)((int)palVar10 == 0 && (int)((ulong)palVar10 >> 0x20) == 0);
                auVar38._8_4_ = -(uint)((int)((ulong)local_118 >> 0x20) == 0 && (int)local_118 == 0)
                ;
                auVar38._12_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
                iVar12 = movmskps(iVar12,auVar38);
                if (iVar12 == 0) {
                  local_110 = 0;
                  len = 0x7fffffffffffffff;
                  uVar27 = (ulong)(uint)gap;
                  c[1] = ~(long)iVar8 + 0x7fffffffffffffff;
                  c[0] = size;
                  parasail_memset___m128i(palVar9,c,0x7fffffffffffffff);
                  c_00[1] = extraout_RDX;
                  c_00[0] = size;
                  palVar23 = b;
                  parasail_memset___m128i(b,c_00,len);
                  uVar6 = (uint)size;
                  lVar19 = size * uVar24 * 4;
                  lVar14 = -0x4000000000000000;
                  local_f8 = 0;
                  uVar21 = 0;
                  auVar38 = _DAT_008a1de0;
                  do {
                    uVar22 = (uint)local_110;
                    if (uVar21 == uVar24) {
LAB_00563507:
                      if (lVar14 == 0x7fffffffffffffff) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar8 = parasail_result_is_saturated(result);
                      palVar23 = local_118;
                      if (iVar8 == 0) {
                        if (uVar22 == s2Len - 2U) {
                          palVar23 = palVar10;
                        }
                        if (uVar22 == s2Len - 1U) {
                          palVar23 = palVar9;
                          palVar9 = local_118;
                        }
                        iVar8 = uVar25 - 1;
                        for (uVar24 = 0; (uVar6 & 0x3fffffff) * 2 != (int)uVar24;
                            uVar24 = uVar24 + 1) {
                          if ((*palVar23)[uVar24] == lVar14) {
                            uVar25 = 0;
                            if ((uVar24 & 1) != 0) {
                              uVar25 = uVar6;
                            }
                            iVar12 = uVar25 + ((uint)(uVar24 >> 1) & 0x7fffffff);
                            if (iVar12 < iVar8) {
                              iVar8 = iVar12;
                            }
                          }
                        }
                        if (uVar22 != s2Len - 2U) {
                          local_118 = palVar10;
                        }
                        if (uVar22 != s2Len - 1U) {
                          palVar10 = local_118;
                        }
                      }
                      else {
                        uVar22 = 0;
                        lVar14 = -1;
                        iVar8 = 0;
                      }
                      result->score = (int)lVar14;
                      result->end_query = iVar8;
                      result->end_ref = uVar22;
                      parasail_free(b);
                      parasail_free(palVar23);
                      parasail_free(palVar10);
                      parasail_free(palVar9);
                      return result;
                    }
                    lVar32 = palVar9[uVar6 - 1][0];
                    iVar8 = ppVar3->mapper[(byte)s2[uVar21]];
                    uVar13 = (int)uVar21 - 2;
                    palVar26 = palVar10;
                    if (uVar22 == uVar13) {
                      palVar26 = local_118;
                    }
                    lVar28 = 0;
                    auVar62 = (undefined1  [16])0x0;
                    uVar18 = local_f8;
                    for (lVar20 = 0; auVar29 = _DAT_008a1890, uStack_50 = (ulong)(uint)gap,
                        size * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
                      plVar1 = (long *)((long)pvVar2 + lVar20 + (long)(int)(iVar8 * uVar6) * 0x10);
                      auVar35._0_8_ = lVar28 + *plVar1;
                      auVar35._8_8_ = lVar32 + plVar1[1];
                      auVar44 = *(undefined1 (*) [16])((long)*b + lVar20);
                      auVar33 = auVar35 ^ _DAT_008a1890;
                      auVar40 = auVar44 ^ _DAT_008a1890;
                      iVar12 = -(uint)(auVar40._0_4_ < auVar33._0_4_);
                      iVar50 = -(uint)(auVar40._4_4_ < auVar33._4_4_);
                      iVar51 = -(uint)(auVar40._8_4_ < auVar33._8_4_);
                      iVar52 = -(uint)(auVar40._12_4_ < auVar33._12_4_);
                      auVar53._4_4_ = iVar12;
                      auVar53._0_4_ = iVar12;
                      auVar53._8_4_ = iVar51;
                      auVar53._12_4_ = iVar51;
                      iVar12 = -(uint)(auVar40._4_4_ == auVar33._4_4_);
                      iVar51 = -(uint)(auVar40._12_4_ == auVar33._12_4_);
                      auVar34._4_4_ = iVar12;
                      auVar34._0_4_ = iVar12;
                      auVar34._8_4_ = iVar51;
                      auVar34._12_4_ = iVar51;
                      auVar41._4_4_ = iVar50;
                      auVar41._0_4_ = iVar50;
                      auVar41._8_4_ = iVar52;
                      auVar41._12_4_ = iVar52;
                      auVar41 = auVar41 | auVar34 & auVar53;
                      auVar42 = ~auVar41 & auVar44 | auVar35 & auVar41;
                      auVar33 = auVar42 ^ _DAT_008a1890;
                      auVar35 = auVar62 ^ _DAT_008a1890;
                      iVar12 = -(uint)(auVar35._0_4_ < auVar33._0_4_);
                      iVar50 = -(uint)(auVar35._4_4_ < auVar33._4_4_);
                      iVar51 = -(uint)(auVar35._8_4_ < auVar33._8_4_);
                      iVar52 = -(uint)(auVar35._12_4_ < auVar33._12_4_);
                      auVar54._4_4_ = iVar12;
                      auVar54._0_4_ = iVar12;
                      auVar54._8_4_ = iVar51;
                      auVar54._12_4_ = iVar51;
                      iVar12 = -(uint)(auVar35._4_4_ == auVar33._4_4_);
                      iVar51 = -(uint)(auVar35._12_4_ == auVar33._12_4_);
                      auVar40._4_4_ = iVar12;
                      auVar40._0_4_ = iVar12;
                      auVar40._8_4_ = iVar51;
                      auVar40._12_4_ = iVar51;
                      auVar36._4_4_ = iVar50;
                      auVar36._0_4_ = iVar50;
                      auVar36._8_4_ = iVar52;
                      auVar36._12_4_ = iVar52;
                      auVar36 = auVar36 | auVar40 & auVar54;
                      auVar35 = ~auVar36 & auVar62 | auVar42 & auVar36;
                      auVar33 = auVar35 ^ _DAT_008a1890;
                      iVar12 = -(uint)((int)DAT_008a1890 < auVar33._0_4_);
                      iVar50 = -(uint)(DAT_008a1890._4_4_ < auVar33._4_4_);
                      iVar51 = -(uint)(DAT_008a1890._8_4_ < auVar33._8_4_);
                      iVar52 = -(uint)(DAT_008a1890._12_4_ < auVar33._12_4_);
                      auVar49._4_4_ = iVar12;
                      auVar49._0_4_ = iVar12;
                      auVar49._8_4_ = iVar51;
                      auVar49._12_4_ = iVar51;
                      iVar12 = -(uint)(auVar33._4_4_ == DAT_008a1890._4_4_);
                      iVar51 = -(uint)(auVar33._12_4_ == DAT_008a1890._12_4_);
                      auVar55._4_4_ = iVar12;
                      auVar55._0_4_ = iVar12;
                      auVar55._8_4_ = iVar51;
                      auVar55._12_4_ = iVar51;
                      auVar42._4_4_ = iVar50;
                      auVar42._0_4_ = iVar50;
                      auVar42._8_4_ = iVar52;
                      auVar42._12_4_ = iVar52;
                      auVar35 = (auVar42 | auVar55 & auVar49) & auVar35;
                      *(undefined1 (*) [16])((long)*palVar26 + lVar20) = auVar35;
                      piVar4 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + uVar18) = auVar35._0_4_;
                      palVar23 = (__m128i *)((long)piVar4 + uVar18);
                      *(int *)((long)*palVar23 + lVar19) = auVar35._8_4_;
                      auVar33 = auVar35 ^ auVar29;
                      auVar40 = auVar38 ^ auVar29;
                      iVar12 = -(uint)(auVar40._0_4_ < auVar33._0_4_);
                      iVar51 = -(uint)(auVar40._4_4_ < auVar33._4_4_);
                      iVar50 = -(uint)(auVar40._8_4_ < auVar33._8_4_);
                      iVar52 = -(uint)(auVar40._12_4_ < auVar33._12_4_);
                      auVar56._4_4_ = iVar12;
                      auVar56._0_4_ = iVar12;
                      auVar56._8_4_ = iVar50;
                      auVar56._12_4_ = iVar50;
                      auVar43._4_4_ = -(uint)(auVar40._4_4_ == auVar33._4_4_);
                      auVar43._12_4_ = -(uint)(auVar40._12_4_ == auVar33._12_4_);
                      auVar43._0_4_ = auVar43._4_4_;
                      auVar43._8_4_ = auVar43._12_4_;
                      auVar37._4_4_ = iVar51;
                      auVar37._0_4_ = iVar51;
                      auVar37._8_4_ = iVar52;
                      auVar37._12_4_ = iVar52;
                      auVar37 = auVar37 | auVar43 & auVar56;
                      auVar38 = ~auVar37 & auVar38 | auVar35 & auVar37;
                      uStack_40 = (ulong)(uint)open;
                      auVar30._0_8_ = auVar35._0_8_ - (ulong)(uint)open;
                      auVar30._8_8_ = auVar35._8_8_ - uStack_40;
                      auVar33._0_8_ = auVar44._0_8_ - uVar27;
                      auVar33._8_8_ = auVar44._8_8_ - uStack_50;
                      auVar44 = auVar33 ^ auVar29;
                      auVar35 = auVar30 ^ auVar29;
                      iVar12 = -(uint)(auVar35._0_4_ < auVar44._0_4_);
                      iVar50 = auVar35._4_4_;
                      auVar57._4_4_ = -(uint)(iVar50 < auVar44._4_4_);
                      iVar51 = -(uint)(auVar35._8_4_ < auVar44._8_4_);
                      iVar52 = auVar35._12_4_;
                      auVar57._12_4_ = -(uint)(iVar52 < auVar44._12_4_);
                      auVar61._4_4_ = iVar12;
                      auVar61._0_4_ = iVar12;
                      auVar61._8_4_ = iVar51;
                      auVar61._12_4_ = iVar51;
                      auVar45._4_4_ = -(uint)(auVar44._4_4_ == iVar50);
                      auVar45._12_4_ = -(uint)(auVar44._12_4_ == iVar52);
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar57._0_4_ = auVar57._4_4_;
                      auVar57._8_4_ = auVar57._12_4_;
                      auVar57 = auVar57 | auVar45 & auVar61;
                      *(undefined1 (*) [16])((long)*b + lVar20) =
                           ~auVar57 & auVar30 | auVar33 & auVar57;
                      auVar63._0_8_ = auVar62._0_8_ - uVar27;
                      auVar63._8_8_ = auVar62._8_8_ - uStack_50;
                      auVar29 = auVar63 ^ auVar29;
                      iVar12 = -(uint)(auVar35._0_4_ < auVar29._0_4_);
                      auVar46._4_4_ = -(uint)(iVar50 < auVar29._4_4_);
                      iVar51 = -(uint)(auVar35._8_4_ < auVar29._8_4_);
                      auVar46._12_4_ = -(uint)(iVar52 < auVar29._12_4_);
                      auVar58._4_4_ = iVar12;
                      auVar58._0_4_ = iVar12;
                      auVar58._8_4_ = iVar51;
                      auVar58._12_4_ = iVar51;
                      auVar44._4_4_ = -(uint)(auVar29._4_4_ == iVar50);
                      auVar44._12_4_ = -(uint)(auVar29._12_4_ == iVar52);
                      auVar44._0_4_ = auVar44._4_4_;
                      auVar44._8_4_ = auVar44._12_4_;
                      auVar46._0_4_ = auVar46._4_4_;
                      auVar46._8_4_ = auVar46._12_4_;
                      auVar46 = auVar46 | auVar44 & auVar58;
                      auVar62 = auVar63 & auVar46 | ~auVar46 & auVar30;
                      plVar1 = (long *)((long)*palVar9 + lVar20);
                      lVar28 = *plVar1;
                      lVar32 = plVar1[1];
                      uVar18 = uVar18 + uVar24 * 4;
                    }
                    if (uVar22 == uVar13) {
                      local_118 = palVar10;
                    }
                    uVar16 = (ulong)uVar13;
                    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
                      lStack_d0 = auVar62._0_8_;
                      lVar28 = 0;
                      uVar11 = local_f8;
                      uVar15 = 0;
                      while (auVar62 = _DAT_008a1890, uVar16 = uVar15 + 0x10,
                            size * 0x10 + 0x10 != uVar16) {
                        auVar29 = *(undefined1 (*) [16])((long)*palVar26 + uVar15);
                        auVar7._8_8_ = lStack_d0;
                        auVar7._0_8_ = lVar28;
                        auVar44 = auVar7 ^ _DAT_008a1890;
                        auVar33 = auVar29 ^ _DAT_008a1890;
                        iVar12 = -(uint)(auVar44._0_4_ < auVar33._0_4_);
                        iVar51 = -(uint)(auVar44._4_4_ < auVar33._4_4_);
                        iVar50 = -(uint)(auVar44._8_4_ < auVar33._8_4_);
                        iVar52 = -(uint)(auVar44._12_4_ < auVar33._12_4_);
                        auVar59._4_4_ = iVar12;
                        auVar59._0_4_ = iVar12;
                        auVar59._8_4_ = iVar50;
                        auVar59._12_4_ = iVar50;
                        auVar47._4_4_ = -(uint)(auVar33._4_4_ == auVar44._4_4_);
                        auVar47._12_4_ = -(uint)(auVar33._12_4_ == auVar44._12_4_);
                        auVar47._0_4_ = auVar47._4_4_;
                        auVar47._8_4_ = auVar47._12_4_;
                        auVar31._4_4_ = iVar51;
                        auVar31._0_4_ = iVar51;
                        auVar31._8_4_ = iVar52;
                        auVar31._12_4_ = iVar52;
                        auVar31 = auVar31 | auVar47 & auVar59;
                        auVar29 = ~auVar31 & auVar7 | auVar29 & auVar31;
                        *(undefined1 (*) [16])((long)*palVar26 + uVar15) = auVar29;
                        piVar4 = ((result->field_4).rowcols)->score_row;
                        *(int *)((long)piVar4 + uVar11) = auVar29._0_4_;
                        *(int *)(lVar19 + (long)piVar4 + uVar11) = auVar29._8_4_;
                        auVar44 = auVar29 ^ auVar62;
                        auVar62 = auVar38 ^ auVar62;
                        iVar12 = -(uint)(auVar62._0_4_ < auVar44._0_4_);
                        iVar50 = -(uint)(auVar62._4_4_ < auVar44._4_4_);
                        iVar51 = -(uint)(auVar62._8_4_ < auVar44._8_4_);
                        iVar52 = -(uint)(auVar62._12_4_ < auVar44._12_4_);
                        auVar60._4_4_ = iVar12;
                        auVar60._0_4_ = iVar12;
                        auVar60._8_4_ = iVar51;
                        auVar60._12_4_ = iVar51;
                        iVar12 = -(uint)(auVar62._4_4_ == auVar44._4_4_);
                        iVar51 = -(uint)(auVar62._12_4_ == auVar44._12_4_);
                        auVar39._4_4_ = iVar12;
                        auVar39._0_4_ = iVar12;
                        auVar39._8_4_ = iVar51;
                        auVar39._12_4_ = iVar51;
                        auVar48._4_4_ = iVar50;
                        auVar48._0_4_ = iVar50;
                        auVar48._8_4_ = iVar52;
                        auVar48._12_4_ = iVar52;
                        auVar48 = auVar48 | auVar39 & auVar60;
                        auVar38 = ~auVar48 & auVar38 | auVar29 & auVar48;
                        lVar28 = lVar28 - uVar27;
                        lStack_d0 = lStack_d0 - uStack_50;
                        a[1] = lVar20;
                        a[0] = (longlong)palVar23;
                        b_00[1] = (longlong)piVar4;
                        b_00[0] = (long)piVar4 + uVar11;
                        _mm_cmpgt_epi64_rpl(a,b_00);
                        uVar5 = (ushort)(SUB161(extraout_XMM0 >> 7,0) & 1) |
                                (ushort)(SUB161(extraout_XMM0 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(extraout_XMM0 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(extraout_XMM0 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(extraout_XMM0 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(extraout_XMM0[0xf] >> 7) << 0xf;
                        uVar18 = (ulong)uVar5;
                        uVar11 = uVar11 + uVar24 * 4;
                        uVar15 = uVar16;
                        if (uVar5 == 0) goto LAB_005633fe;
                      }
                      auVar62._8_8_ = lStack_d0;
                      auVar62._0_8_ = lVar28;
                      uVar16 = uVar15;
                    }
LAB_005633fe:
                    a_00[1] = lVar20;
                    a_00[0] = (longlong)palVar23;
                    b_01[1] = uVar16;
                    b_01[0] = uVar18;
                    _mm_cmpgt_epi64_rpl(a_00,b_01);
                    palVar10 = palVar9;
                    palVar9 = palVar26;
                    if ((((((((((((((((extraout_XMM0_00 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (extraout_XMM0_00 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (extraout_XMM0_00 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (extraout_XMM0_00 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (extraout_XMM0_00 >> 0x27 & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                                 (extraout_XMM0_00 >> 0x2f & (undefined1  [16])0x1) !=
                                 (undefined1  [16])0x0) ||
                                (extraout_XMM0_00 >> 0x37 & (undefined1  [16])0x1) !=
                                (undefined1  [16])0x0) ||
                               (extraout_XMM0_00 >> 0x3f & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0) ||
                              (extraout_XMM0_00 >> 0x47 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                             (extraout_XMM0_00 >> 0x4f & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0) ||
                            (extraout_XMM0_00 >> 0x57 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) ||
                           (extraout_XMM0_00 >> 0x5f & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                          (extraout_XMM0_00 >> 0x67 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) ||
                         (extraout_XMM0_00 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                         ) || (extraout_XMM0_00 >> 0x77 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) || extraout_XMM0_00[0xf] < '\0') {
                      lVar14 = auVar38._8_8_;
                      if (auVar38._8_8_ < auVar38._0_8_) {
                        lVar14 = auVar38._0_8_;
                      }
                      if (c[1] < lVar14) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        s2Len = (int)uVar21;
                        goto LAB_00563507;
                      }
                      local_110 = uVar21 & 0xffffffff;
                    }
                    uVar21 = uVar21 + 1;
                    local_f8 = local_f8 + 4;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar17 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse2_128_64",pcVar17);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}